

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

void __thiscall QToolBar::changeEvent(QToolBar *this,QEvent *event)

{
  short sVar1;
  long lVar2;
  QString *pQVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QStyleOptionToolBar opt;
  QSize local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 100) {
    (**(code **)(**(long **)(lVar2 + 0x278) + 0x70))();
    if (*(char *)(lVar2 + 0x254) == '\0') {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_88);
      (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionToolBar *)local_88);
      pQVar4 = QWidget::style(&this->super_QWidget);
      local_90.wd.m_i =
           (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x3b,(QStyleOptionToolBar *)local_88,this);
      local_90.ht.m_i = local_90.wd.m_i;
      setIconSize(this,&local_90);
      *(undefined1 *)(lVar2 + 0x254) = 0;
      QStyleOption::~QStyleOption((QStyleOption *)local_88);
    }
    QToolBarLayout::updateMarginAndSpacing(*(QToolBarLayout **)(lVar2 + 0x278));
  }
  else if (sVar1 == 0x5a) {
    (**(code **)(**(long **)(lVar2 + 0x278) + 0x70))();
  }
  else if (sVar1 == 0x21) {
    pQVar3 = *(QString **)(lVar2 + 0x270);
    QWidget::windowTitle((QString *)local_88,&this->super_QWidget);
    QAction::setText(pQVar3);
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
  }
  QWidget::changeEvent(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::changeEvent(QEvent *event)
{
    Q_D(QToolBar);
    switch (event->type()) {
    case QEvent::WindowTitleChange:
        d->toggleViewAction->setText(windowTitle());
        break;
    case QEvent::StyleChange:
        d->layout->invalidate();
        if (!d->explicitIconSize) {
            QStyleOptionToolBar opt;
            initStyleOption(&opt);
            const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, &opt, this);
            setIconSize({metric, metric});
            d->explicitIconSize = false;
        }
        d->layout->updateMarginAndSpacing();
        break;
    case QEvent::LayoutDirectionChange:
        d->layout->invalidate();
        break;
    default:
        break;
    }
    QWidget::changeEvent(event);
}